

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O3

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,Fl_Menu_Item *item)

{
  Fl_Menu_Item *this_00;
  int iVar1;
  Fl_Menu_Item *pFVar2;
  long lVar3;
  
  this_00 = this->menu_;
  if (this_00 == (Fl_Menu_Item *)0x0) {
    pFVar2 = (Fl_Menu_Item *)0x0;
    lVar3 = 0;
  }
  else {
    iVar1 = Fl_Menu_Item::size(this_00);
    lVar3 = (long)iVar1;
    pFVar2 = this->menu_;
  }
  iVar1 = -1;
  if ((pFVar2 <= item) && (item < this_00 + lVar3)) {
    iVar1 = (int)((ulong)((long)item - (long)pFVar2) >> 3) * -0x49249249;
  }
  return iVar1;
}

Assistant:

int Fl_Menu_::find_index(const Fl_Menu_Item *item) const {
  Fl_Menu_Item *max = menu_+size();
  if (item<menu_ || item>=max) return(-1);
  return (int) (item-menu_);
}